

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void scheme_cb(Fl_Choice *param_1,void *param_2)

{
  int iVar1;
  void *param_1_local;
  Fl_Choice *param_0_local;
  
  if (batch_mode == 0) {
    iVar1 = Fl_Choice::value(scheme_choice);
    switch(iVar1) {
    case 0:
      Fl::scheme((char *)0x0);
      break;
    case 1:
      Fl::scheme("none");
      break;
    case 2:
      Fl::scheme("plastic");
      break;
    case 3:
      Fl::scheme("gtk+");
      break;
    case 4:
      Fl::scheme("gleam");
    }
    iVar1 = Fl_Choice::value(scheme_choice);
    Fl_Preferences::set(&fluid_prefs,"scheme",iVar1);
  }
  return;
}

Assistant:

void scheme_cb(Fl_Choice *, void *) {
  if (batch_mode)
    return;

  switch (scheme_choice->value()) {
    case 0 : // Default
      Fl::scheme(NULL);
      break;
    case 1 : // None
      Fl::scheme("none");
      break;
    case 2 : // Plastic
      Fl::scheme("plastic");
      break;
    case 3 : // GTK+
      Fl::scheme("gtk+");
      break;
    case 4 : // Gleam
      Fl::scheme("gleam");
      break;
  }

  fluid_prefs.set("scheme", scheme_choice->value());
}